

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_type_indexed_
               (MPIABI_Fint *count,int *array_of_blocklengths,int *array_of_displacements,
               MPIABI_Fint *oldtype,MPIABI_Fint *newtype,MPIABI_Fint *ierror)

{
  mpi_type_indexed_();
  return;
}

Assistant:

void mpiabi_type_indexed_(
  const MPIABI_Fint * count,
  const int * array_of_blocklengths,
  const int * array_of_displacements,
  const MPIABI_Fint * oldtype,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_indexed_(
    count,
    array_of_blocklengths,
    array_of_displacements,
    oldtype,
    newtype,
    ierror
  );
}